

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O2

string * __thiscall
absl::StrCat<char_const*>
          (string *__return_storage_ptr__,absl *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d
          ,AlphaNum *e,char **args)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined8 local_70;
  undefined8 uStack_68;
  size_t local_60;
  char *pcStack_58;
  size_t local_50;
  char *pcStack_48;
  size_t local_40;
  char *pcStack_38;
  size_t local_30;
  char *pcStack_28;
  string_view local_20;
  
  local_70 = *(undefined8 *)this;
  uStack_68 = *(undefined8 *)(this + 8);
  local_60 = (a->piece_)._M_len;
  pcStack_58 = (a->piece_)._M_str;
  local_50 = (b->piece_)._M_len;
  pcStack_48 = (b->piece_)._M_str;
  local_40 = (c->piece_)._M_len;
  pcStack_38 = (c->piece_)._M_str;
  local_30 = (d->piece_)._M_len;
  pcStack_28 = (d->piece_)._M_str;
  local_20 = NullSafeStringView((Nullable<const_char_*>)(e->piece_)._M_len);
  pieces._M_len = (size_type)b;
  pieces._M_array = (iterator)0x6;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_70,pieces);
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string StrCat(
    const AlphaNum& a, const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
    const AlphaNum& e, const AV&... args) {
  return strings_internal::CatPieces(
      {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
       static_cast<const AlphaNum&>(args).Piece()...});
}